

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_init_eb2.cpp
# Opt level: O0

void __thiscall NavierStokesBase::set_body_state(NavierStokesBase *this,MultiFab *S)

{
  bool bVar1;
  FabArray<amrex::BaseFab<int>_> *in_RSI;
  AsyncArray<double,_0> *in_RDI;
  Real *state_lcl;
  Array4<int> *mask;
  Array4<double> *state;
  Box *bx;
  MFIter mfi;
  AsyncArray<double,_0> body_state_lcl;
  int covered_val;
  int nc;
  MFIter *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  undefined1 local_1e8 [15];
  undefined1 in_stack_fffffffffffffe27;
  FabArrayBase *in_stack_fffffffffffffe28;
  MFIter *in_stack_fffffffffffffe30;
  anon_class_144_5_b9e81f71 *in_stack_fffffffffffffe48;
  Box *in_stack_fffffffffffffe50;
  undefined1 auStack_1a8 [8];
  MFIter *in_stack_fffffffffffffe60;
  undefined1 local_150 [64];
  undefined1 *local_110;
  undefined1 local_108 [64];
  undefined1 *local_c8;
  undefined1 local_bc [52];
  MFIter local_88;
  NavierStokesBase *in_stack_ffffffffffffffe0;
  
  if (!no_eb_in_domain) {
    if (!body_state_set) {
      define_body_state(in_stack_ffffffffffffffe0);
    }
    amrex::FabArrayBase::nComp(&in_RSI->super_FabArrayBase);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x73d0d6);
    amrex::Gpu::AsyncArray<double,_0>::AsyncArray
              (in_RDI,in_stack_fffffffffffffe08,(size_t)in_stack_fffffffffffffe00);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
    while (bVar1 = amrex::MFIter::isValid(&local_88), bVar1) {
      amrex::MFIter::tilebox(in_stack_fffffffffffffe60);
      local_bc._28_8_ = local_bc;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_RSI,in_stack_fffffffffffffe00);
      local_c8 = local_108;
      amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                (in_RSI,in_stack_fffffffffffffe00);
      local_110 = local_150;
      amrex::Gpu::AsyncArray<double,_0>::data((AsyncArray<double,_0> *)&stack0xffffffffffffffd8);
      in_stack_fffffffffffffe00 = (MFIter *)local_bc._28_8_;
      memcpy(local_1e8,local_c8,0x3c);
      memcpy(auStack_1a8,local_110,0x3c);
      amrex::ParallelFor<NavierStokesBase::set_body_state(amrex::MultiFab&)::__0>
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      amrex::MFIter::operator++(&local_88);
    }
    amrex::MFIter::~MFIter(in_stack_fffffffffffffe00);
    amrex::Gpu::AsyncArray<double,_0>::~AsyncArray((AsyncArray<double,_0> *)0x73d293);
  }
  return;
}

Assistant:

void
NavierStokesBase::set_body_state(MultiFab& S)
{
  if (no_eb_in_domain) return;

  if (!body_state_set)
  {
    define_body_state();
  }

  BL_ASSERT(S.nComp() == body_state.size());
  int nc = S.nComp();
  int covered_val = -1;

  // Need a GPU copy of body_state that's not a static attribute of the NSB class
  AsyncArray<amrex::Real> body_state_lcl(body_state.data(),nc);

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
  for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
  {
    const Box& bx = mfi.tilebox();
    auto const& state = S.array(mfi);
    auto const& mask = ebmask.array(mfi);
    Real* state_lcl = body_state_lcl.data();
    amrex::ParallelFor(bx, [state,mask,nc,covered_val,state_lcl]
    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        set_body_state_k(i,j,k,nc,state_lcl,covered_val,mask,state);
    });
  }
}